

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_factory.hpp
# Opt level: O3

void __thiscall
iutest::detail::iuParamTestFactory<iu_TestPAutoAny_x_iutest_x_Test_Test>::~iuParamTestFactory
          (iuParamTestFactory<iu_TestPAutoAny_x_iutest_x_Test_Test> *this)

{
  placeholder *ppVar1;
  
  (this->super_iuParamTestFactoryBase<iutest::any>).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuParamTestFactoryBase_002311a0;
  ppVar1 = (this->super_iuParamTestFactoryBase<iutest::any>).m_param.content;
  if (ppVar1 != (placeholder *)0x0) {
    (*ppVar1->_vptr_placeholder[1])();
  }
  operator_delete(this,0x10);
  return;
}

Assistant:

class iuParamTestFactory IUTEST_CXX_FINAL : public iuParamTestFactoryBase<typename Tester::ParamType>
{
    typedef typename Tester::ParamType ParamType;
    typedef iuParamTestFactoryBase<ParamType> _Mybase;
public:
    iuParamTestFactory() IUTEST_CXX_DEFAULT_FUNCTION
    explicit iuParamTestFactory(ParamType param) : _Mybase(param) {}

public:
    virtual auto_ptr<Test> Create() IUTEST_CXX_OVERRIDE
    {
        Tester::SetParam(&this->m_param);
        auto_ptr<Test> p( new Tester() );
        return p;
    }